

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O2

bool __thiscall ON_Object::SetUserString(ON_Object *this,wchar_t *key,wchar_t *string_value)

{
  bool bVar1;
  ON_UserStringList *this_00;
  bool bVar2;
  
  this_00 = ON_UserStringList::FromObject(this);
  if (this_00 == (ON_UserStringList *)0x0) {
    this_00 = (ON_UserStringList *)operator_new(0xe0);
    ON_UserStringList::ON_UserStringList(this_00);
    bVar1 = AttachUserData(this,(ON_UserData *)this_00);
    bVar2 = true;
    if (!bVar1) goto LAB_0065de7b;
  }
  else {
    bVar2 = false;
  }
  bVar1 = ON_UserStringList::SetUserString(this_00,key,string_value);
  if (bVar1) {
    if ((bVar2) && ((this_00->super_ON_UserData).m_userdata_copycount == 2)) {
      (this_00->super_ON_UserData).m_userdata_copycount = 1;
    }
    return true;
  }
  if (!bVar2) {
    return false;
  }
LAB_0065de7b:
  (*(this_00->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(this_00);
  return false;
}

Assistant:

bool ON_Object::SetUserString( const wchar_t* key, const wchar_t* string_value )
{
  ON_UserStringList* us = ON_UserStringList::FromObject(this);

  bool b = false;
  if ( nullptr == us )
  {
    us = new ON_UserStringList();
    if ( !AttachUserData(us) )
    {
      delete us;
      us = nullptr;
    }
    else
    {
      b = true;
    }
  }

  if ( us )
  {
    if ( us->SetUserString(key,string_value) )
    {
      if ( b && 2 == us->m_userdata_copycount )
      {
        // user data is brand new - roll back the 
        // m_userdata_copycount++ that happens in 
        // SetUserString().
        us->m_userdata_copycount = 1;
      }
      b = true;
    }
    else if ( b )
    {
      // user data was new-ed up and has nothing in it
      // because the input was bogus.
      delete us;
      us = nullptr;
      b = false;
    }
  }
  return b;
}